

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagProbe.cpp
# Opt level: O1

void __thiscall Js::StepController::Deactivate(StepController *this,InterpreterHaltState *haltState)

{
  ReturnedValueList *pRVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  long lVar5;
  
  if (((haltState == (InterpreterHaltState *)0x0) || (haltState->stopType != STOP_STEPCOMPLETE)) ||
     ((this->stepType == STEP_IN && (0 < this->returnedValueRecordingDepth)))) {
    this->returnedValueRecordingDepth = 0;
    pRVar1 = this->returnedValueList;
    if ((pRVar1 != (ReturnedValueList *)0x0) &&
       (lVar5 = (long)(pRVar1->
                      super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).
                      count, lVar5 != 0)) {
      memset((pRVar1->super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).
             buffer.ptr,0,lVar5 << 3);
      (pRVar1->super_ReadOnlyList<Js::ReturnedValue_*,_Memory::Recycler,_DefaultComparer>).count = 0
      ;
    }
  }
  if ((this->body).ptr != (FunctionBody *)0x0) {
    if (this->pActivatedContext == (ScriptContext *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagProbe.cpp"
                                  ,0xd0,"(this->pActivatedContext)","this->pActivatedContext");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    Memory::RecyclerRootPtr<Js::FunctionBody>::Unroot(&this->body,this->pActivatedContext->recycler)
    ;
  }
  this->pActivatedContext = (ScriptContext *)0x0;
  this->stepType = STEP_NONE;
  this->byteOffset = -1;
  this->statementMap = (StatementMap *)0x0;
  this->frameCountWhenSet = 0;
  this->scriptIdWhenSet = 0xffffffff;
  this->frameAddrWhenSet = 0xffffffffffffffff;
  return;
}

Assistant:

void StepController::Deactivate(InterpreterHaltState* haltState /*=nullptr*/)
    {
        // If we are deactivating the step controller during ProbeContainer close or attach/detach we should clear return value list
        // If we break other than step -> clear the list.
        // If we step in and we land on different function (we are in recording phase the current function) -> clear the list
        if ((haltState == nullptr) || (haltState->stopType != Js::STOP_STEPCOMPLETE || (this->stepType == STEP_IN && this->returnedValueRecordingDepth > 0)))
        {
            ResetReturnedValueList();
        }

        if (this->body)
        {
            Assert(this->pActivatedContext);
            this->body.Unroot(this->pActivatedContext->GetRecycler());
        }
        this->pActivatedContext = NULL;
        stepType = STEP_NONE;
        byteOffset = Js::Constants::NoByteCodeOffset;
        statementMap = NULL;

        frameCountWhenSet = 0;
        scriptIdWhenSet = InvalidScriptId;
        frameAddrWhenSet = (size_t)-1;
    }